

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void ssh_spr_close(Ssh *ssh,SeatPromptResult spr,char *context)

{
  SeatPromptResult spr_00;
  char *ptr;
  undefined8 unaff_RBX;
  undefined8 unaff_R14;
  undefined8 unaff_retaddr;
  
  if (spr.kind == SPRK_SW_ABORT) {
    spr_00.errfn = (_func_void_SeatPromptResult_BinarySink_ptr *)unaff_R14;
    spr_00._0_8_ = unaff_RBX;
    spr_00.errdata_u = 2;
    spr_00.errdata_lit = (char *)unaff_retaddr;
    spr_00._28_4_ = spr._4_4_;
    ptr = spr_get_error_message(spr_00);
    ssh_sw_abort(ssh,"%s",ptr);
    safefree(ptr);
    return;
  }
  if (spr.kind == SPRK_USER_ABORT) {
    ssh_user_close(ssh,"User aborted at %s",context);
    return;
  }
  __assert_fail("spr.kind == SPRK_SW_ABORT",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c",
                0x47f,"void ssh_spr_close(Ssh *, SeatPromptResult, const char *)");
}

Assistant:

void ssh_spr_close(Ssh *ssh, SeatPromptResult spr, const char *context)
{
    if (spr.kind == SPRK_USER_ABORT) {
        ssh_user_close(ssh, "User aborted at %s", context);
    } else {
        assert(spr.kind == SPRK_SW_ABORT);
        char *err = spr_get_error_message(spr);
        ssh_sw_abort(ssh, "%s", err);
        sfree(err);
    }
}